

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteInlineImport(WatWriter *this,ExternalKind kind,Index index)

{
  value_type pIVar1;
  string_view sVar2;
  size_type sVar3;
  reference ppIVar4;
  Import *import;
  size_t kind_index;
  Index index_local;
  ExternalKind kind_local;
  WatWriter *this_local;
  
  if ((this->options_->inline_import & 1U) != 0) {
    sVar3 = std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::size
                      (this->inline_import_map_ + (int)kind);
    if (index < sVar3) {
      ppIVar4 = std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::operator[]
                          (this->inline_import_map_ + (int)kind,(ulong)index);
      pIVar1 = *ppIVar4;
      WriteOpenSpace(this,"import");
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&pIVar1->module_name);
      WriteQuotedString(this,sVar2,Space);
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&pIVar1->field_name);
      WriteQuotedString(this,sVar2,Space);
      WriteCloseSpace(this);
    }
  }
  return;
}

Assistant:

void WatWriter::WriteInlineImport(ExternalKind kind, Index index) {
  if (!options_.inline_import) {
    return;
  }

  size_t kind_index = static_cast<size_t>(kind);

  if (index >= inline_import_map_[kind_index].size()) {
    return;
  }

  const Import* import = inline_import_map_[kind_index][index];
  WriteOpenSpace("import");
  WriteQuotedString(import->module_name, NextChar::Space);
  WriteQuotedString(import->field_name, NextChar::Space);
  WriteCloseSpace();
}